

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_d.h
# Opt level: O2

VectorD<float,_3> __thiscall
draco::CrossProduct<float>(draco *this,VectorD<float,_3> *u,VectorD<float,_3> *v)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  VectorD<float,_3> VVar9;
  
  VectorD<float,_3>::VectorD((VectorD<float,_3> *)this);
  fVar1 = (v->v_)._M_elems[0];
  fVar2 = (u->v_)._M_elems[0];
  uVar3 = *(undefined8 *)((u->v_)._M_elems + 1);
  uVar4 = *(undefined8 *)((v->v_)._M_elems + 1);
  fVar5 = (float)uVar3;
  fVar6 = (float)((ulong)uVar3 >> 0x20);
  fVar7 = (float)uVar4;
  fVar8 = (float)((ulong)uVar4 >> 0x20);
  *(ulong *)this = CONCAT44(fVar1 * fVar6 - fVar2 * fVar8,fVar8 * fVar5 - fVar6 * fVar7);
  VVar9.v_._M_elems[0] = fVar1 * fVar5;
  VVar9.v_._M_elems[1] = 0.0;
  VVar9.v_._M_elems[2] = fVar2 * fVar7 - VVar9.v_._M_elems[0];
  *(float *)(this + 8) = VVar9.v_._M_elems[2];
  return (VectorD<float,_3>)VVar9.v_._M_elems;
}

Assistant:

VectorD<ScalarT, 3> CrossProduct(const VectorD<ScalarT, 3> &u,
                                 const VectorD<ScalarT, 3> &v) {
  // Preventing accidental use with uint32_t and the like.
  static_assert(std::is_signed<ScalarT>::value,
                "ScalarT must be a signed type. ");
  VectorD<ScalarT, 3> r;
  r[0] = (u[1] * v[2]) - (u[2] * v[1]);
  r[1] = (u[2] * v[0]) - (u[0] * v[2]);
  r[2] = (u[0] * v[1]) - (u[1] * v[0]);
  return r;
}